

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [39];
  byte local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [55];
  byte local_49;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_48;
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = (text *)__return_storage_ptr__;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_49 = 0;
  local_81 = 0;
  if (local_20 == -1) {
    std::make_tuple<std::__cxx11::string&,char_const(&)[1]>(&local_48,arg,(char (*) [1])0x11460c);
    local_49 = 1;
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_true>
              (__return_storage_ptr__,&local_48);
  }
  else {
    std::__cxx11::string::substr((ulong)local_80,(ulong)arg);
    local_81 = 1;
    std::__cxx11::string::substr((ulong)local_a8,(ulong)arg);
    std::make_tuple<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,local_80,local_a8);
    std::__cxx11::string::~string((string *)local_a8);
  }
  if ((local_81 & 1) != 0) {
    std::__cxx11::string::~string((string *)local_80);
  }
  if ((local_49 & 1) != 0) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
    ::~tuple(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto split_option( text arg ) -> std::tuple<text, text>
{
    auto pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_tuple( arg, "" )
                : std::make_tuple( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}